

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::clear
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this)

{
  bool bVar1;
  consume_operation consume;
  consume_operation local_20;
  
  local_20.m_control = (ControlBlock *)0x0;
  while( true ) {
    bVar1 = try_start_consume(this,&local_20);
    if (!bVar1) break;
    consume_operation::commit(&local_20);
  }
  bVar1 = empty(this);
  if (!bVar1) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x1e8);
  }
  clean_dead_elements(this);
  consume_operation::~consume_operation(&local_20);
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }

            DENSITY_ASSERT_INTERNAL(empty());

            clean_dead_elements();
        }